

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeoLocusIntersect.cpp
# Opt level: O2

int GeoCalcs::GeoLocusIntersect
              (LLPoint *gStart,LLPoint *gEnd,Locus *loc,LLPoint *intersect,double dTol,double dEps)

{
  LLPoint *pLVar1;
  double dVar2;
  bool bVar3;
  uint uVar4;
  LLPoint LVar5;
  double distBase;
  double distFromPt;
  double errarray [2];
  double distarray [2];
  double crsFromPt;
  double dist23;
  double crs32;
  InverseResult result;
  double dist13;
  double crs31;
  LLPoint local_118;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c0;
  double local_b8;
  LLPoint *local_b0;
  LLPoint *local_a8;
  LLPoint *local_a0;
  double local_98;
  LLPoint local_90;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  undefined8 uStack_60;
  InverseResult local_58;
  double local_40;
  double local_38;
  
  local_58.azimuth = 0.0;
  local_58.reverseAzimuth = 0.0;
  local_58.distance = 0.0;
  local_108 = dEps;
  DistVincenty(gStart,gEnd,&local_58);
  local_100 = local_58.azimuth;
  pLVar1 = &loc->locusStart;
  DistVincenty(pLVar1,&loc->locusEnd,&local_58);
  local_68 = local_58.distance;
  uStack_60 = 0;
  local_118.latitude = 0.0;
  local_118.longitude = 0.0;
  bVar3 = CrsIntersect(pLVar1,local_58.azimuth,&local_38,&local_40,gStart,local_100,&local_70,
                       &local_78,dTol,&local_118);
  uVar4 = 0;
  if (bVar3) {
    local_b0 = pLVar1;
    local_a8 = &loc->locusEnd;
    local_a0 = intersect;
    DistVincenty(&loc->geoStart,&loc->geoEnd,&local_58);
    local_98 = local_58.azimuth;
    LVar5 = PerpIntercept(&loc->geoStart,local_58.azimuth,&local_118,&local_80,&local_f0,dTol);
    local_90.latitude = LVar5.latitude;
    local_90.longitude = LVar5.longitude;
    dVar2 = DistToLocusP(loc,&local_90,dTol,local_108);
    local_e0 = local_f0 - ABS(dVar2);
    local_c0 = local_78;
    local_d0 = local_78;
    local_b8 = local_e0;
    dVar2 = SignAzimuthDifference(local_80,local_70);
    dVar2 = cos(dVar2);
    local_f8 = local_c0 - local_b8 / dVar2;
    for (uVar4 = 0; ((pLVar1 = local_a0, !NAN(local_f8) && (dTol < ABS(local_e0))) && (uVar4 < 10));
        uVar4 = uVar4 + 1) {
      LVar5 = DestVincenty(gStart,local_100,local_f8);
      local_118.latitude = LVar5.latitude;
      local_118.longitude = LVar5.longitude;
      local_e8 = local_e0;
      local_d8 = local_d0;
      local_d0 = local_f8;
      LVar5 = PerpIntercept(&loc->geoStart,local_98,&local_118,&local_80,&local_f0,dTol);
      local_90.latitude = LVar5.latitude;
      local_90.longitude = LVar5.longitude;
      dVar2 = DistToLocusP(loc,&local_90,dTol,local_108);
      local_e0 = local_f0 - ABS(dVar2);
      FindLinearRoot(&local_d8,&local_e8,&local_f8);
    }
    local_a0->latitude = local_118.latitude;
    local_a0->longitude = local_118.longitude;
    DistVincenty(local_a0,local_b0,&local_58);
    dVar2 = local_58.distance;
    DistVincenty(pLVar1,local_a8,&local_58);
    uVar4 = (uint)(ABS(local_68 - (dVar2 + local_58.distance)) < 0.005);
  }
  return uVar4;
}

Assistant:

int GeoLocusIntersect(const LLPoint &gStart, const LLPoint &gEnd, const Locus &loc, LLPoint &intersect,
                          double dTol, double dEps)
    {
        InverseResult result;
        DistVincenty(gStart, gEnd, result);
        const double gAz = result.azimuth;

        DistVincenty(loc.locusStart, loc.locusEnd, result);
        const double locStAz = result.azimuth;
        const double locLength = result.distance;

        double crs31, crs32, dist13, dist23;
        LLPoint pt1;
        if (!CrsIntersect(loc.locusStart, locStAz, crs31, dist13, gStart, gAz, crs32, dist23, dTol, pt1))
            return 0;

        DistVincenty(loc.geoStart, loc.geoEnd, result);

        const double tcrs = result.azimuth;
        double crsFromPt, distFromPt;
        LLPoint ptInt = PerpIntercept(loc.geoStart, tcrs, pt1, crsFromPt, distFromPt, dTol);

        double distLoc = DistToLocusP(loc, ptInt, dTol, dEps);

        double distarray[2];
        double errarray[2];
        errarray[1] = distFromPt - fabs(distLoc);
        distarray[1] = dist23;

        double distBase = dist23 - errarray[1] / cos(fabs(SignAzimuthDifference(crsFromPt, crs32)));

        int k = 0;
        const int maxCount = 10;
        while (!std::isnan(distBase) && fabs(errarray[1]) > dTol && k < maxCount)
        {
            pt1 = DestVincenty(gStart, gAz, distBase);
            errarray[0] = errarray[1];
            distarray[0] = distarray[1];
            distarray[1] = distBase;

            ptInt = PerpIntercept(loc.geoStart, tcrs, pt1, crsFromPt, distFromPt, dTol);
            distLoc = DistToLocusP(loc, ptInt, dTol, dEps);
            errarray[1] = distFromPt - fabs(distLoc);

            FindLinearRoot(distarray, errarray, distBase);
            k++;
        }
        intersect = pt1;

        DistVincenty(intersect, loc.locusStart, result);
        const double distLocStPt1 = result.distance;
        DistVincenty(intersect, loc.locusEnd, result);

        // found intersect point must be on or between locus
        // If 5e-3 is to tight a tolerance then try setting to 5e-2
        // For the 8260.54A Appendix test cases 1e-3 was to tight, 5e-3
        // works just fine.
        if (!IsNearZero(locLength - (distLocStPt1 + result.distance), 5e-3))
            return 0;
        return 1;
    }